

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.h
# Opt level: O2

size_t __thiscall
xemmai::t_context::f_tail<&xemmai::t_type_of<xemmai::t_object>::f_plus>
          (t_context *this,t_object *a_this)

{
  size_t sVar1;
  t_pvalue *ptVar2;
  t_value<xemmai::t_pointer> *__first;
  long in_FS_OFFSET;
  
  __first = this->v_base + *(long *)(this->v_lambda->v_data + 0x28);
  sVar1 = (*a_this->v_type->f_plus)(a_this,__first);
  if (sVar1 == 0xffffffffffffffff) {
    ptVar2 = this->v_base;
    ptVar2[-2].super_t_pointer.v_p = (__first->super_t_pointer).v_p;
    ptVar2[-2].field_0 = __first->field_0;
    ptVar2 = this->v_previous;
  }
  else {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<xemmai::t_value<xemmai::t_pointer>*,xemmai::t_value<xemmai::t_pointer>*>
              (__first,__first + sVar1 + 2,this->v_base + -2);
    ptVar2 = this->v_base + sVar1;
    if (this->v_base + sVar1 <= this->v_previous) {
      ptVar2 = this->v_previous;
    }
  }
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar2;
  return sVar1;
}

Assistant:

size_t t_context::f_tail(t_object* a_this)
{
	auto stack = v_base + v_lambda->f_as<t_lambda>().v_privates;
	size_t n = (a_this->f_type()->*A_function)(a_this, stack);
	if (n == size_t(-1))
		f_return(stack[0]);
	else
		f_tail(stack, n);
	return n;
}